

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

ProStringList * __thiscall QMakeEvaluator::valuesRef(QMakeEvaluator *this,ProKey *variableName)

{
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  ProStringList *pPVar6;
  QArrayDataPointer<ProString> *this_00;
  _List_node_base *p_Var7;
  
  iVar2 = QMap<ProKey,_ProStringList>::find
                    ((QMap<ProKey,_ProStringList> *)
                     ((this->m_valuemapStack).
                      super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                      .
                      super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                      ._M_impl._M_node.super__List_node_base._M_prev + 1),variableName);
  iVar3._M_node =
       (_Base_ptr)
       QMap<ProKey,_ProStringList>::end
                 ((QMap<ProKey,_ProStringList> *)
                  ((this->m_valuemapStack).
                   super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                   .
                   super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                   ._M_impl._M_node.super__List_node_base._M_prev + 1));
  if (iVar2.i._M_node != (iterator)iVar3._M_node) {
    if (*(long *)((long)iVar2.i._M_node + 0x58) == QMakeInternal::statics._608_8_) {
      QList<ProString>::clear((QList<ProString> *)((long)iVar2.i._M_node + 0x50));
    }
    return (ProStringList *)(QList<ProString> *)((long)iVar2.i._M_node + 0x50);
  }
  bVar1 = isFunctParam(variableName);
  p_Var7 = (this->m_valuemapStack).
           super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
           super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
           ._M_impl._M_node.super__List_node_base._M_prev;
  if ((!bVar1) &&
     (p_Var7 != (this->m_valuemapStack).
                super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                .
                super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                ._M_impl._M_node.super__List_node_base._M_next)) {
    do {
      p_Var7 = p_Var7->_M_prev;
      cVar4 = QMap<ProKey,_ProStringList>::find
                        ((QMap<ProKey,_ProStringList> *)(p_Var7 + 1),variableName);
      cVar5._M_node = (_Base_ptr)p_Var7[1]._M_next;
      if (cVar5._M_node != (_Base_ptr)0x0) {
        cVar5._M_node = (_Base_ptr)&(cVar5._M_node)->_M_left;
      }
      if (cVar4.i._M_node != (const_iterator)cVar5._M_node) {
        this_00 = (QArrayDataPointer<ProString> *)
                  QMap<ProKey,_ProStringList>::operator[]
                            ((QMap<ProKey,_ProStringList> *)
                             ((this->m_valuemapStack).
                              super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                              .
                              super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                              ._M_impl._M_node.super__List_node_base._M_prev + 1),variableName);
        if (*(long *)((long)cVar4.i._M_node + 0x58) == QMakeInternal::statics._608_8_) {
          return (ProStringList *)this_00;
        }
        QArrayDataPointer<ProString>::operator=
                  (this_00,(QArrayDataPointer<ProString> *)((long)cVar4.i._M_node + 0x50));
        return (ProStringList *)this_00;
      }
    } while (p_Var7 != (this->m_valuemapStack).
                       super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                       .
                       super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
                       ._M_impl._M_node.super__List_node_base._M_next);
    p_Var7 = (this->m_valuemapStack).
             super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
             super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
             ._M_impl._M_node.super__List_node_base._M_prev;
  }
  pPVar6 = QMap<ProKey,_ProStringList>::operator[]
                     ((QMap<ProKey,_ProStringList> *)(p_Var7 + 1),variableName);
  return pPVar6;
}

Assistant:

ProStringList &QMakeEvaluator::valuesRef(const ProKey &variableName)
{
    ProValueMap::Iterator it = m_valuemapStack.top().find(variableName);
    if (it != m_valuemapStack.top().end()) {
        if (it->constBegin() == statics.fakeValue.constBegin())
            it->clear();
        return *it;
    }
    if (!isFunctParam(variableName)) {
        ProValueMapStack::iterator vmi = m_valuemapStack.end();
        if (--vmi != m_valuemapStack.begin()) {
            do {
                --vmi;
                ProValueMap::ConstIterator it = (*vmi).constFind(variableName);
                if (it != (*vmi).constEnd()) {
                    ProStringList &ret = m_valuemapStack.top()[variableName];
                    if (it->constBegin() != statics.fakeValue.constBegin())
                        ret = *it;
                    return ret;
                }
            } while (vmi != m_valuemapStack.begin());
        }
    }
    return m_valuemapStack.top()[variableName];
}